

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void setResultStrOrError(sqlite3_context *pCtx,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  u8 desiredEnc;
  Mem *pMem;
  int iVar1;
  
  pMem = pCtx->pOut;
  iVar1 = sqlite3VdbeMemSetStr(pMem,z,(long)n,enc,xDel);
  if (iVar1 != 0) {
    if (iVar1 != 0x12) {
      sqlite3_result_error_nomem(pCtx);
      return;
    }
LAB_00125128:
    pCtx->isError = 0x12;
    sqlite3VdbeMemSetStr(pCtx->pOut,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0);
    return;
  }
  desiredEnc = pCtx->enc;
  if ((pMem->flags & 2) == 0) {
    pMem->enc = desiredEnc;
  }
  else if (pMem->enc != desiredEnc) {
    sqlite3VdbeMemTranslate(pMem,desiredEnc);
  }
  if ((pMem->flags & 0x12) != 0) {
    iVar1 = pMem->n;
    if ((pMem->flags >> 10 & 1) != 0) {
      iVar1 = iVar1 + (pMem->u).nZero;
    }
    if (pMem->db->aLimit[0] < iVar1) goto LAB_00125128;
  }
  return;
}

Assistant:

static void setResultStrOrError(
  sqlite3_context *pCtx,  /* Function context */
  const char *z,          /* String pointer */
  int n,                  /* Bytes in string, or negative */
  u8 enc,                 /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*)     /* Destructor function */
){
  Mem *pOut = pCtx->pOut;
  int rc = sqlite3VdbeMemSetStr(pOut, z, n, enc, xDel);
  if( rc ){
    if( rc==SQLITE_TOOBIG ){
      sqlite3_result_error_toobig(pCtx);
    }else{
      /* The only errors possible from sqlite3VdbeMemSetStr are
      ** SQLITE_TOOBIG and SQLITE_NOMEM */
      assert( rc==SQLITE_NOMEM );
      sqlite3_result_error_nomem(pCtx);
    }
    return;
  }
  sqlite3VdbeChangeEncoding(pOut, pCtx->enc);
  if( sqlite3VdbeMemTooBig(pOut) ){
    sqlite3_result_error_toobig(pCtx);
  }
}